

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  VarData *pVVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  char *__function;
  int iVar10;
  vec<Minisat::Solver::Watcher,_int> *pvVar11;
  int iVar12;
  long lVar13;
  uint *puVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  long lVar18;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll(&this->watches);
  if (0 < this->next_var) {
    lVar9 = 0;
    do {
      uVar8 = 0;
      bVar7 = true;
      do {
        bVar17 = bVar7;
        uVar8 = uVar8 | lVar9 * 2;
        if ((long)(this->watches).occs.map.sz <= (long)uVar8) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x28,
                        "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
                       );
        }
        pvVar11 = (this->watches).occs.map.data;
        if (0 < pvVar11[uVar8].sz) {
          pvVar11 = pvVar11 + uVar8;
          lVar18 = 0;
          lVar13 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar11->data->cref + lVar18),to);
            lVar13 = lVar13 + 1;
            lVar18 = lVar18 + 8;
          } while (lVar13 < pvVar11->sz);
        }
        uVar8 = 1;
        bVar7 = false;
      } while (bVar17);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->next_var);
  }
  iVar16 = (this->trail).sz;
  if (0 < iVar16) {
    lVar9 = 0;
    do {
      iVar10 = (this->trail).data[lVar9].x >> 1;
      iVar12 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz;
      if (iVar12 <= iVar10) {
LAB_0010bb23:
        __function = 
        "const V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) const [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
LAB_0010bb8d:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,__function);
      }
      pVVar6 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      uVar2 = pVVar6[iVar10].reason;
      uVar8 = (ulong)uVar2;
      if (uVar8 != 0xffffffff) {
        uVar3 = (this->ca).ra.sz;
        if (uVar3 <= uVar2) {
          __assert_fail("r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                        ,0x3f,
                        "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        puVar14 = (this->ca).ra.memory;
        uVar4 = puVar14[uVar8];
        if ((uVar4 & 0x10) == 0) {
          uVar5 = puVar14[uVar8 + 1];
          iVar15 = (int)uVar5 >> 1;
          if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              sz <= iVar15) {
            __function = 
            "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
            ;
            goto LAB_0010bb8d;
          }
          bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                  map.data[iVar15].value;
          if (((byte)uVar5 & 1 ^ bVar1) == l_True && (l_True & 2) == 0 || (bVar1 & l_True & 2) != 0)
          {
            if (iVar12 <= iVar15) goto LAB_0010bb23;
            uVar5 = pVVar6[iVar15].reason;
            if (uVar5 != 0xffffffff) {
              if (uVar3 <= uVar5) {
                __assert_fail("r < sz",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                              ,0x43,
                              "const T *Minisat::RegionAllocator<unsigned int>::lea(Ref) const [T = unsigned int]"
                             );
              }
              if (uVar5 == uVar2) goto LAB_0010b954;
            }
          }
        }
        else {
LAB_0010b954:
          if ((uVar4 & 3) == 1) {
            __assert_fail("!isRemoved(reason(v))",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                          ,0x405,"void Minisat::Solver::relocAll(ClauseAllocator &)");
          }
          ClauseAllocator::reloc(&this->ca,&pVVar6[iVar10].reason,to);
          iVar16 = (this->trail).sz;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar16);
  }
  iVar16 = (this->learnts).sz;
  if (iVar16 < 1) {
    if (iVar16 < 0) goto LAB_0010bbb6;
  }
  else {
    puVar14 = (this->learnts).data;
    lVar13 = 0;
    lVar9 = 0;
    iVar12 = 0;
    do {
      if ((this->ca).ra.sz <= *(uint *)((long)puVar14 + lVar13)) goto LAB_0010bb04;
      if (((this->ca).ra.memory[*(uint *)((long)puVar14 + lVar13)] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar14 + lVar13),to);
        puVar14 = (this->learnts).data;
        lVar18 = (long)iVar12;
        iVar12 = iVar12 + 1;
        puVar14[lVar18] = *(uint *)((long)puVar14 + lVar13);
        iVar16 = (this->learnts).sz;
      }
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 4;
    } while (lVar9 < iVar16);
    iVar10 = (int)lVar9 - iVar12;
    if (iVar16 < iVar10) goto LAB_0010bbb6;
    if (0 < iVar10) {
      (this->learnts).sz = (iVar16 + iVar12) - (int)lVar9;
    }
  }
  iVar16 = (this->clauses).sz;
  if (iVar16 < 1) {
    if (iVar16 < 0) goto LAB_0010bbb6;
  }
  else {
    puVar14 = (this->clauses).data;
    lVar13 = 0;
    lVar9 = 0;
    iVar12 = 0;
    do {
      if ((this->ca).ra.sz <= *(uint *)((long)puVar14 + lVar13)) {
LAB_0010bb04:
        __assert_fail("r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                      ,0x40,
                      "const T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) const [T = unsigned int]"
                     );
      }
      if (((this->ca).ra.memory[*(uint *)((long)puVar14 + lVar13)] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar14 + lVar13),to);
        puVar14 = (this->clauses).data;
        lVar18 = (long)iVar12;
        iVar12 = iVar12 + 1;
        puVar14[lVar18] = *(uint *)((long)puVar14 + lVar13);
        iVar16 = (this->clauses).sz;
      }
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 4;
    } while (lVar9 < iVar16);
    iVar10 = (int)lVar9 - iVar12;
    if (iVar16 < iVar10) {
LAB_0010bbb6:
      __assert_fail("nelems <= sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                    ,0x41,
                    "void Minisat::vec<unsigned int>::shrink(Size) [T = unsigned int, _Size = int]")
      ;
    }
    if (0 < iVar10) {
      (this->clauses).sz = (iVar16 + iVar12) - (int)lVar9;
    }
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}